

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O0

int PixarLogGuessDataFmt(TIFFDirectory *td)

{
  uint16_t uVar1;
  int local_14;
  int format;
  int guess;
  TIFFDirectory *td_local;
  
  local_14 = -1;
  uVar1 = td->td_sampleformat;
  switch(td->td_bitspersample) {
  case 8:
    if ((uVar1 == 4) || (uVar1 == 1)) {
      local_14 = 0;
    }
    break;
  case 0xb:
    if ((uVar1 == 4) || (uVar1 == 1)) {
      local_14 = 2;
    }
    break;
  case 0xc:
    if ((uVar1 == 4) || (uVar1 == 2)) {
      local_14 = 3;
    }
    break;
  case 0x10:
    if ((uVar1 == 4) || (uVar1 == 1)) {
      local_14 = 4;
    }
    break;
  case 0x20:
    if (uVar1 == 3) {
      local_14 = 5;
    }
  }
  return local_14;
}

Assistant:

static int PixarLogGuessDataFmt(TIFFDirectory *td)
{
    int guess = PIXARLOGDATAFMT_UNKNOWN;
    int format = td->td_sampleformat;

    /* If the user didn't tell us his datafmt,
     * take our best guess from the bitspersample.
     */
    switch (td->td_bitspersample)
    {
        case 32:
            if (format == SAMPLEFORMAT_IEEEFP)
                guess = PIXARLOGDATAFMT_FLOAT;
            break;
        case 16:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_16BIT;
            break;
        case 12:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_INT)
                guess = PIXARLOGDATAFMT_12BITPICIO;
            break;
        case 11:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_11BITLOG;
            break;
        case 8:
            if (format == SAMPLEFORMAT_VOID || format == SAMPLEFORMAT_UINT)
                guess = PIXARLOGDATAFMT_8BIT;
            break;
    }

    return guess;
}